

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  int *piVar1;
  size_t __size;
  ulong uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Allocator *pAVar10;
  Allocator *pAVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  int iVar16;
  int iVar17;
  int *piVar18;
  undefined1 auVar19 [14];
  int n;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  undefined4 extraout_var;
  long lVar24;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  void *pvVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  void *pvVar40;
  uint uVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  void *local_398;
  void *local_390;
  void *local_388;
  void *local_380;
  ulong local_378;
  void *local_368;
  void *local_360;
  int *local_358;
  int *local_350;
  long local_328;
  short w4 [6];
  short w3 [6];
  int local_2cc;
  int local_2c8;
  int local_2c4;
  short w2 [6];
  int local_2ac;
  int local_2a8;
  int local_2a4;
  short w1 [6];
  int local_28c;
  int local_288;
  int local_284;
  short t5 [6];
  short t4 [6];
  short t3 [6];
  short t2 [6];
  short t1 [6];
  short t0 [6];
  short w5 [6];
  undefined1 local_1f8 [56];
  size_t local_1c0;
  void *ptr;
  undefined8 uStack_1b0;
  size_t sStack_1a8;
  int iStack_1a0;
  Allocator *local_198;
  int iStack_190;
  uint uStack_18c;
  uint local_188;
  uint uStack_184;
  size_t sStack_180;
  short w0 [6];
  short d1 [6];
  short d5 [6];
  short d4 [6];
  short d3 [6];
  short d2 [6];
  Option opt_b;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined2 uVar51;
  
  iVar23 = bottom_blob->c;
  lVar36 = (long)iVar23;
  iVar7 = top_blob->w;
  iVar8 = top_blob->h;
  uVar9 = top_blob->c;
  local_1f8._0_8_ = bottom_blob->data;
  local_1f8._8_8_ = bottom_blob->refcount;
  local_1f8._16_8_ = bottom_blob->elemsize;
  local_1f8._24_4_ = bottom_blob->elempack;
  local_1f8._32_8_ = bottom_blob->allocator;
  iVar21 = bottom_blob->w;
  iVar32 = bottom_blob->h;
  local_1f8._40_4_ = bottom_blob->dims;
  local_1f8._44_4_ = bottom_blob->w;
  local_1f8._48_4_ = bottom_blob->h;
  local_1f8._52_4_ = bottom_blob->c;
  local_1c0 = bottom_blob->cstep;
  if ((int *)local_1f8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1f8._8_8_ = *(int *)local_1f8._8_8_ + 1;
    UNLOCK();
    iVar21 = bottom_blob->w;
    iVar32 = bottom_blob->h;
  }
  uVar31 = iVar7 + 6;
  if (-1 < (int)(iVar7 + 3U)) {
    uVar31 = iVar7 + 3U;
  }
  uVar35 = uVar31 & 0xfffffffc;
  uVar41 = iVar8 + 6;
  if (-1 < (int)(iVar8 + 3U)) {
    uVar41 = iVar8 + 3U;
  }
  uVar25 = uVar41 & 0xfffffffc;
  iVar38 = uVar35 + 2;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.blob_allocator = opt->workspace_allocator;
  copy_make_border(bottom_blob,(Mat *)local_1f8,0,(uVar25 + 2) - iVar32,0,iVar38 - iVar21,0,0.0,
                   &opt_b);
  uVar31 = (int)uVar31 >> 2;
  uVar41 = (int)uVar41 >> 2;
  uVar20 = uVar41 * uVar31;
  pAVar10 = opt->workspace_allocator;
  uVar26 = (ulong)(int)(uVar20 * 0x24);
  uVar42 = uVar26 + 7 & 0x7ffffffffffffff8;
  lVar43 = uVar42 * lVar36;
  if (lVar43 == 0) {
    local_358 = (int *)0x0;
    local_398 = (void *)0x0;
  }
  else {
    if (pAVar10 == (Allocator *)0x0) {
      local_398 = (void *)0x0;
      ptr = (void *)0x0;
      iVar21 = posix_memalign(&ptr,0x10,lVar43 * 2 + 4);
      if (iVar21 == 0) {
        local_398 = ptr;
      }
    }
    else {
      iVar21 = (*pAVar10->_vptr_Allocator[2])();
      local_398 = (void *)CONCAT44(extraout_var,iVar21);
    }
    local_358 = (int *)((long)local_398 + lVar43 * 2);
    *(undefined4 *)((long)local_398 + lVar43 * 2) = 1;
  }
  if (0 < iVar23) {
    lVar43 = (long)iVar38;
    uVar30 = 1;
    if (1 < (int)uVar31) {
      uVar30 = uVar31;
    }
    uVar27 = 1;
    if (1 < (int)uVar41) {
      uVar27 = (ulong)uVar41;
    }
    local_328 = 0;
    do {
      if (0 < iVar8) {
        pvVar40 = (void *)(uVar42 * 2 * local_328 + (long)local_398);
        uVar28 = 0;
        do {
          if (0 < iVar7) {
            lVar34 = local_1f8._0_8_ +
                     (long)(iVar38 * 4 * (int)uVar28) + local_1c0 * local_1f8._16_8_ * local_328;
            lVar45 = lVar34 + lVar43;
            lVar37 = lVar45 + lVar43;
            lVar44 = lVar37 + lVar43;
            lVar39 = lVar44 + lVar43;
            lVar33 = lVar39 + lVar43;
            uVar22 = 0;
            do {
              lVar24 = 0;
              do {
                *(short *)((long)&ptr + lVar24 * 2) = (short)*(char *)(lVar34 + lVar24);
                d1[lVar24] = (short)*(char *)(lVar45 + lVar24);
                d2[lVar24] = (short)*(char *)(lVar37 + lVar24);
                d3[lVar24] = (short)*(char *)(lVar44 + lVar24);
                d4[lVar24] = (short)*(char *)(lVar39 + lVar24);
                d5[lVar24] = (short)*(char *)(lVar33 + lVar24);
                lVar24 = lVar24 + 1;
              } while (lVar24 != 6);
              lVar24 = 0;
              do {
                sVar3 = *(short *)((long)d2 + lVar24);
                sVar4 = *(short *)((long)d4 + lVar24);
                *(short *)((long)w0 + lVar24) =
                     *(short *)((long)&ptr + lVar24) * 4 + sVar3 * -5 + sVar4;
                sVar5 = *(short *)((long)d1 + lVar24);
                sVar6 = *(short *)((long)d3 + lVar24);
                *(short *)((long)w1 + lVar24) = sVar4 + (sVar3 + sVar5) * -4 + sVar6;
                *(short *)((long)w2 + lVar24) = (sVar4 - sVar6) + (sVar5 - sVar3) * 4;
                *(short *)((long)w3 + lVar24) = (sVar4 - (sVar3 + sVar5 * 2)) + sVar6 * 2;
                *(short *)((long)w4 + lVar24) = (sVar4 + sVar5 * 2) - (sVar3 + sVar6 * 2);
                *(short *)((long)w5 + lVar24) =
                     sVar5 * 4 + sVar6 * -5 + *(short *)((long)d5 + lVar24);
                lVar24 = lVar24 + 2;
              } while (lVar24 != 0xc);
              t3[0] = w0[3];
              t4[0] = w0[4];
              t5[0] = w0[5];
              t0[1] = w1[0];
              t0[0] = w0[0];
              t1[1] = w1[1];
              t1[0] = w0[1];
              t2[1] = w1[2];
              t2[0] = w0[2];
              t3[1] = w1[3];
              t4[1] = w1[4];
              t5[1] = w1[5];
              t3[2] = w2[3];
              t4[2] = w2[4];
              t5[2] = w2[5];
              t0[2] = (short)w2._0_4_;
              t0[3] = w3[0];
              t1[3] = w3[1];
              t1[2] = w2[1];
              t2[2] = (short)w2._4_4_;
              t2[3] = w3[2];
              t3[3] = w3[3];
              t4[3] = w3[4];
              t5[3] = w3[5];
              t3[4] = w4[3];
              t4[4] = w4[4];
              t5[4] = w4[5];
              t0[4] = (short)w4._0_4_;
              t0[5] = w5[0];
              t1[5] = w5[1];
              t1[4] = w4[1];
              t2[4] = (short)w4._4_4_;
              t2[5] = w5[2];
              t3[5] = w5[3];
              t4[5] = w5[4];
              t5[5] = w5[5];
              lVar24 = 0;
              do {
                sVar3 = *(short *)((long)t2 + lVar24);
                sVar4 = *(short *)((long)t4 + lVar24);
                *(short *)((long)&ptr + lVar24) =
                     *(short *)((long)t0 + lVar24) * 4 + sVar3 * -5 + sVar4;
                sVar5 = *(short *)((long)t1 + lVar24);
                sVar6 = *(short *)((long)t3 + lVar24);
                *(short *)((long)d1 + lVar24) = sVar4 + (sVar3 + sVar5) * -4 + sVar6;
                *(short *)((long)d2 + lVar24) = (sVar4 - sVar6) + (sVar5 - sVar3) * 4;
                *(short *)((long)d3 + lVar24) = (sVar4 - (sVar3 + sVar5 * 2)) + sVar6 * 2;
                *(short *)((long)d4 + lVar24) = (sVar4 + sVar5 * 2) - (sVar3 + sVar6 * 2);
                *(short *)((long)d5 + lVar24) =
                     sVar5 * 4 + sVar6 * -5 + *(short *)((long)t5 + lVar24);
                lVar24 = lVar24 + 2;
              } while (lVar24 != 0xc);
              lVar24 = 0;
              do {
                *(undefined2 *)((long)pvVar40 + lVar24) = *(undefined2 *)((long)&ptr + lVar24);
                *(undefined2 *)((long)pvVar40 + lVar24 + 0xc) = *(undefined2 *)((long)d1 + lVar24);
                *(undefined2 *)((long)pvVar40 + lVar24 + 0x18) = *(undefined2 *)((long)d2 + lVar24);
                *(undefined2 *)((long)pvVar40 + lVar24 + 0x24) = *(undefined2 *)((long)d3 + lVar24);
                *(undefined2 *)((long)pvVar40 + lVar24 + 0x30) = *(undefined2 *)((long)d4 + lVar24);
                *(undefined2 *)((long)pvVar40 + lVar24 + 0x3c) = *(undefined2 *)((long)d5 + lVar24);
                lVar24 = lVar24 + 2;
              } while (lVar24 != 0xc);
              lVar34 = lVar34 + 4;
              lVar45 = lVar45 + 4;
              lVar37 = lVar37 + 4;
              lVar44 = lVar44 + 4;
              lVar39 = lVar39 + 4;
              lVar33 = lVar33 + 4;
              pvVar40 = (void *)((long)pvVar40 + 0x48);
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar30);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar27);
      }
      local_328 = local_328 + 1;
    } while (local_328 != lVar36);
  }
  sStack_1a8 = 0;
  iStack_1a0 = 0;
  ptr = (void *)0x0;
  uStack_1b0._0_4_ = 0;
  uStack_1b0._4_4_ = 0;
  local_198 = (Allocator *)0x0;
  iStack_190 = 0;
  uStack_18c = 0;
  local_188 = 0;
  uStack_184 = 0;
  sStack_180 = 0;
  if ((int *)local_1f8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1f8._8_8_ = *(int *)local_1f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_1f8._8_8_ == 0) {
      if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1f8._0_8_ != (void *)0x0) {
          free((void *)local_1f8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1f8._32_8_)[3])();
      }
    }
  }
  local_1f8._8_8_ = CONCAT44(uStack_1b0._4_4_,(undefined4)uStack_1b0);
  local_1f8._0_8_ = ptr;
  local_1f8._16_8_ = sStack_1a8;
  local_1f8._24_4_ = iStack_1a0;
  local_1f8._32_8_ = local_198;
  local_1f8._44_4_ = uStack_18c;
  local_1f8._40_4_ = iStack_190;
  local_1f8._48_4_ = local_188;
  local_1f8._52_4_ = uStack_184;
  local_1c0 = sStack_180;
  if ((int *)local_1f8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1f8._8_8_ = *(int *)local_1f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_1f8._8_8_ == 0) {
      if (local_198 == (Allocator *)0x0) {
        if (ptr != (void *)0x0) {
          free(ptr);
        }
      }
      else {
        (*local_198->_vptr_Allocator[3])();
      }
    }
  }
  pAVar11 = opt->workspace_allocator;
  lVar43 = (uVar26 & 0x3ffffffffffffffc) * (long)(int)uVar9;
  if (lVar43 == 0) {
    local_390 = (void *)0x0;
    local_350 = (int *)0x0;
  }
  else {
    if (pAVar11 == (Allocator *)0x0) {
      ptr = (void *)0x0;
      iVar21 = posix_memalign(&ptr,0x10,lVar43 * 4 + 4);
      local_390 = (void *)0x0;
      if (iVar21 == 0) {
        local_390 = ptr;
      }
    }
    else {
      iVar21 = (*pAVar11->_vptr_Allocator[2])();
      local_390 = (void *)CONCAT44(extraout_var_00,iVar21);
    }
    local_350 = (int *)((long)local_390 + lVar43 * 4);
    *(undefined4 *)((long)local_390 + lVar43 * 4) = 1;
  }
  if (0 < (int)uVar9) {
    local_388 = kernel_tm->data;
    sVar12 = kernel_tm->elemsize;
    sVar13 = kernel_tm->cstep;
    uVar27 = 0;
    local_368 = local_390;
    do {
      if (0 < (int)uVar20) {
        iVar21 = kernel_tm->w;
        iVar32 = 0;
        uVar28 = 0;
        pvVar40 = local_368;
        do {
          memset(&ptr,0,0x90);
          if (0 < iVar23) {
            lVar43 = (ulong)(uint)(iVar32 * 8) + (long)local_398;
            lVar45 = 0;
            pvVar29 = local_388;
            do {
              lVar37 = 0;
              do {
                uVar2 = *(ulong *)(lVar43 + lVar37 * 2);
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar2;
                auVar14._12_2_ = (short)(uVar2 >> 0x30);
                auVar15._8_2_ = (short)(uVar2 >> 0x20);
                auVar15._0_8_ = uVar2;
                auVar15._10_4_ = auVar14._10_4_;
                auVar19._6_8_ = 0;
                auVar19._0_6_ = auVar15._8_6_;
                auVar50._6_8_ = SUB148(auVar19 << 0x40,6);
                auVar50._4_2_ = (short)(uVar2 >> 0x10);
                auVar50._0_2_ = (ushort)uVar2;
                auVar50._2_2_ = 0;
                auVar50._14_2_ = 0;
                uVar2 = *(ulong *)((long)pvVar29 + lVar37 * 2);
                uVar51 = (undefined2)(uVar2 >> 0x30);
                auVar49._8_4_ = 0;
                auVar49._0_8_ = uVar2;
                auVar49._12_2_ = uVar51;
                auVar49._14_2_ = uVar51;
                uVar51 = (undefined2)(uVar2 >> 0x20);
                auVar48._12_4_ = auVar49._12_4_;
                auVar48._8_2_ = 0;
                auVar48._0_8_ = uVar2;
                auVar48._10_2_ = uVar51;
                auVar47._10_6_ = auVar48._10_6_;
                auVar47._8_2_ = uVar51;
                auVar47._0_8_ = uVar2;
                uVar51 = (undefined2)(uVar2 >> 0x10);
                auVar46._8_8_ = auVar47._8_8_;
                auVar46._6_2_ = uVar51;
                auVar46._4_2_ = uVar51;
                auVar46._0_2_ = (undefined2)uVar2;
                auVar46._2_2_ = auVar46._0_2_;
                auVar50 = pmaddwd(auVar46,auVar50);
                lVar44 = lVar37 * 4;
                iVar38 = *(int *)((long)&ptr + lVar44 + 4);
                iVar16 = *(int *)((long)&uStack_1b0 + lVar44);
                iVar17 = *(int *)((long)&uStack_1b0 + lVar44 + 4);
                lVar39 = lVar37 * 4;
                *(int *)((long)&ptr + lVar39) = auVar50._0_4_ + *(int *)((long)&ptr + lVar44);
                *(int *)((long)&ptr + lVar39 + 4) = auVar50._4_4_ + iVar38;
                *(int *)((long)&uStack_1b0 + lVar39) = auVar50._8_4_ + iVar16;
                *(int *)((long)&uStack_1b0 + lVar39 + 4) = auVar50._12_4_ + iVar17;
                lVar37 = lVar37 + 4;
              } while (lVar37 != 0x24);
              lVar45 = lVar45 + 1;
              lVar43 = lVar43 + uVar42 * 2;
              pvVar29 = (void *)((long)pvVar29 + (long)iVar21 * sVar12);
            } while (lVar45 != lVar36);
          }
          lVar43 = 0;
          do {
            *(undefined4 *)((long)pvVar40 + lVar43 * 4) = *(undefined4 *)((long)&ptr + lVar43 * 4);
            lVar43 = lVar43 + 1;
          } while (lVar43 != 0x24);
          uVar28 = uVar28 + 1;
          iVar32 = iVar32 + 9;
          pvVar40 = (void *)((long)pvVar40 + 0x90);
        } while (uVar28 != uVar20);
      }
      uVar27 = uVar27 + 1;
      local_388 = (void *)((long)local_388 + sVar13 * sVar12);
      local_368 = (void *)((long)local_368 + uVar26 * 4);
    } while (uVar27 != uVar9);
  }
  sStack_1a8 = 0;
  iStack_1a0 = 0;
  ptr = (void *)0x0;
  uStack_1b0._0_4_ = 0;
  uStack_1b0._4_4_ = 0;
  local_198 = (Allocator *)0x0;
  iStack_190 = 0;
  uStack_18c = 0;
  local_188 = 0;
  uStack_184 = 0;
  sStack_180 = 0;
  if (local_358 != (int *)0x0) {
    LOCK();
    *local_358 = *local_358 + -1;
    UNLOCK();
    if (*local_358 == 0) {
      if (pAVar10 == (Allocator *)0x0) {
        if (local_398 != (void *)0x0) {
          free(local_398);
        }
      }
      else {
        (*pAVar10->_vptr_Allocator[3])(pAVar10,local_398);
      }
    }
  }
  pAVar10 = local_198;
  pvVar40 = ptr;
  piVar18 = (int *)CONCAT44(uStack_1b0._4_4_,(undefined4)uStack_1b0);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_198 == (Allocator *)0x0) {
        if (ptr != (void *)0x0) {
          free(ptr);
        }
      }
      else {
        (*local_198->_vptr_Allocator[3])();
      }
    }
  }
  local_198 = opt->workspace_allocator;
  ptr = (void *)0x0;
  uStack_1b0._0_4_ = 0;
  uStack_1b0._4_4_ = 0;
  piVar1 = (int *)0x0;
  sStack_1a8 = 4;
  iStack_1a0 = 1;
  iStack_190 = 3;
  uStack_18c = uVar35;
  local_188 = uVar25;
  uStack_184 = uVar9;
  sStack_180 = (long)(int)(uVar25 * uVar35) & 0x3ffffffffffffff0;
  lVar36 = sStack_180 * (long)(int)uVar9;
  if (lVar36 != 0) {
    __size = lVar36 * 4 + 4;
    if (local_198 == (Allocator *)0x0) {
      d1[0] = 0;
      d1[1] = 0;
      d1[2] = 0;
      d1[3] = 0;
      iVar23 = posix_memalign((void **)d1,0x10,__size);
      ptr = (void *)0x0;
      if (iVar23 == 0) {
        ptr = (void *)d1._0_8_;
      }
    }
    else {
      iVar23 = (*local_198->_vptr_Allocator[2])(local_198,__size);
      ptr = (void *)CONCAT44(extraout_var_01,iVar23);
    }
    piVar1 = (int *)(lVar36 * 4 + (long)ptr);
    uStack_1b0._0_4_ = SUB84(piVar1,0);
    uStack_1b0._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
    *(undefined4 *)((long)ptr + lVar36 * 4) = 1;
  }
  if (0 < (int)uVar9) {
    uVar42 = 1;
    if (1 < (int)uVar31) {
      uVar42 = (ulong)uVar31;
    }
    uVar27 = 1;
    if (1 < (int)uVar41) {
      uVar27 = (ulong)uVar41;
    }
    local_378 = 0;
    local_380 = local_390;
    do {
      if (0 < iVar8) {
        lVar36 = sStack_180 * sStack_1a8 * local_378;
        lVar43 = (long)(int)uStack_18c * sStack_1a8;
        local_360 = local_380;
        local_388 = (void *)0x0;
        do {
          if (0 < iVar7) {
            lVar39 = (long)ptr + ((long)local_388 * 4 + 3) * lVar43 + lVar36;
            lVar37 = (long)ptr + ((long)local_388 * 4 + 2) * lVar43 + lVar36;
            lVar45 = (long)ptr + ((long)local_388 * 4 + 1) * lVar43 + lVar36;
            lVar44 = (long)ptr + (long)local_388 * 4 * lVar43 + lVar36;
            uVar28 = 0;
            pvVar29 = local_360;
            do {
              lVar33 = 0;
              do {
                *(undefined4 *)((long)d1 + lVar33) = *(undefined4 *)((long)pvVar29 + lVar33);
                *(undefined4 *)((long)d2 + lVar33) = *(undefined4 *)((long)pvVar29 + lVar33 + 0x18);
                *(undefined4 *)((long)d3 + lVar33) = *(undefined4 *)((long)pvVar29 + lVar33 + 0x30);
                *(undefined4 *)((long)d4 + lVar33) = *(undefined4 *)((long)pvVar29 + lVar33 + 0x48);
                *(undefined4 *)((long)d5 + lVar33) = *(undefined4 *)((long)pvVar29 + lVar33 + 0x60);
                *(undefined4 *)((long)w0 + lVar33) = *(undefined4 *)((long)pvVar29 + lVar33 + 0x78);
                lVar33 = lVar33 + 4;
              } while (lVar33 != 0x18);
              lVar33 = 0;
              do {
                iVar23 = *(int *)((long)d3 + lVar33) + *(int *)((long)d2 + lVar33);
                iVar21 = *(int *)((long)d4 + lVar33) + *(int *)((long)d5 + lVar33);
                *(int *)((long)w1 + lVar33) = iVar23 + *(int *)((long)d1 + lVar33) + iVar21;
                iVar32 = *(int *)((long)d4 + lVar33) - *(int *)((long)d5 + lVar33);
                iVar38 = *(int *)((long)d2 + lVar33) - *(int *)((long)d3 + lVar33);
                *(int *)((long)w2 + lVar33) = iVar38 + iVar32 * 2;
                *(int *)((long)w3 + lVar33) = iVar23 + iVar21 * 4;
                *(int *)((long)w4 + lVar33) = iVar38 + iVar32 * 8 + *(int *)((long)w0 + lVar33);
                lVar33 = lVar33 + 4;
              } while (lVar33 != 0x18);
              w5._0_4_ = w1._0_4_ + local_28c + w1._8_4_ + w1._4_4_ + local_288;
              w5._4_4_ = w2._0_4_ + local_2ac + w2._8_4_ + w2._4_4_ + local_2a8;
              w5._8_4_ = w3._0_4_ + local_2cc + w3._8_4_ + w3._4_4_ + local_2c8;
              t0._0_4_ = (local_28c - local_288) * 2 + (w1._4_4_ - w1._8_4_);
              t0._4_4_ = (local_2ac - local_2a8) * 2 + (w2._4_4_ - w2._8_4_);
              t0._8_4_ = (local_2cc - local_2c8) * 2 + (w3._4_4_ - w3._8_4_);
              t1._0_4_ = (local_288 + local_28c) * 4 + w1._8_4_ + w1._4_4_;
              t1._4_4_ = (local_2a8 + local_2ac) * 4 + w2._8_4_ + w2._4_4_;
              t1._8_4_ = (local_2c8 + local_2cc) * 4 + w3._8_4_ + w3._4_4_;
              t2._0_4_ = (w1._4_4_ - w1._8_4_) + local_284 + (local_28c - local_288) * 8;
              t2._4_4_ = (w2._4_4_ - w2._8_4_) + local_2a4 + (local_2ac - local_2a8) * 8;
              t2._8_4_ = (w3._4_4_ - w3._8_4_) + local_2c4 + (local_2cc - local_2c8) * 8;
              lVar33 = 0;
              do {
                *(int *)(lVar44 + lVar33) = *(int *)((long)w5 + lVar33) / 0x240;
                *(int *)(lVar45 + lVar33) = *(int *)((long)t0 + lVar33) / 0x240;
                *(int *)(lVar37 + lVar33) = *(int *)((long)t1 + lVar33) / 0x240;
                *(int *)(lVar39 + lVar33) = *(int *)((long)t2 + lVar33) / 0x240;
                lVar33 = lVar33 + 4;
              } while (lVar33 != 0x10);
              lVar44 = lVar44 + 0x10;
              lVar45 = lVar45 + 0x10;
              lVar37 = lVar37 + 0x10;
              lVar39 = lVar39 + 0x10;
              uVar28 = uVar28 + 1;
              pvVar29 = (void *)((long)pvVar29 + 0x90);
            } while (uVar28 != uVar42);
          }
          local_388 = (void *)((long)local_388 + 1);
          local_360 = (void *)((long)local_360 + (long)(int)uVar31 * 0x90);
        } while (local_388 != (void *)uVar27);
      }
      local_378 = local_378 + 1;
      local_380 = (void *)((long)local_380 + uVar26 * 4);
    } while (local_378 != uVar9);
  }
  uStack_1b0 = piVar1;
  copy_cut_border((Mat *)&ptr,top_blob,0,local_188 - top_blob->h,0,uStack_18c - top_blob->w,opt);
  if (uStack_1b0 != (int *)0x0) {
    LOCK();
    *uStack_1b0 = *uStack_1b0 + -1;
    UNLOCK();
    if (*uStack_1b0 == 0) {
      if (local_198 == (Allocator *)0x0) {
        if (ptr != (void *)0x0) {
          free(ptr);
        }
      }
      else {
        (*local_198->_vptr_Allocator[3])();
      }
    }
  }
  if (local_350 != (int *)0x0) {
    LOCK();
    *local_350 = *local_350 + -1;
    UNLOCK();
    if (*local_350 == 0) {
      if (pAVar11 == (Allocator *)0x0) {
        if (local_390 != (void *)0x0) {
          free(local_390);
        }
      }
      else {
        (*pAVar11->_vptr_Allocator[3])(pAVar11,local_390);
      }
    }
  }
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (pAVar10 == (Allocator *)0x0) {
        if (pvVar40 != (void *)0x0) {
          free(pvVar40);
        }
      }
      else {
        (*pAVar10->_vptr_Allocator[3])(pAVar10,pvVar40);
      }
    }
  }
  if ((int *)local_1f8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1f8._8_8_ = *(int *)local_1f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_1f8._8_8_ == 0) {
      if ((Allocator *)local_1f8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1f8._0_8_ != (void *)0x0) {
          free((void *)local_1f8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1f8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(6*6, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
        //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
        //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
        //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
        // };

		// 0 =	4 * r00  - 5 * r02	+ r04
        // 1 = -4 * (r01 + r02)  + r03 + r04
        // 2 =	4 * (r01 - r02)  - r03 + r04
        // 3 = -2 * r01 - r02 + 2 * r03 + r04
        // 4 =	2 * r01 - r02 - 2 * r03 + r04
		// 5 =	4 * r01 - 5 * r03 + r05

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 4;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;
                const signed char* r4 = r3 + w;
                const signed char* r5 = r4 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[6],d1[6],d2[6],d3[6],d4[6],d5[6];
                    short w0[6],w1[6],w2[6],w3[6],w4[6],w5[6];
                    short t0[6],t1[6],t2[6],t3[6],t4[6],t5[6];

                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                        d4[n] = r4[n];
                        d5[n] = r5[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 6; n++)
                    {   
                        w0[n] =  4*d0[n]          - 5*d2[n]           + d4[n];
                        w1[n] =          -4*d1[n] - 4*d2[n] +   d3[n] + d4[n];
                        w2[n] =           4*d1[n] - 4*d2[n] -   d3[n] + d4[n];
                        w3[n] =          -2*d1[n] -   d2[n] + 2*d3[n] + d4[n];
                        w4[n] =           2*d1[n] -   d2[n] - 2*d3[n] + d4[n];
                        w5[n] =           4*d1[n]           - 5*d3[n]          + d5[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3]; t4[0]=w0[4]; t5[0]=w0[5];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3]; t4[1]=w1[4]; t5[1]=w1[5];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3]; t4[2]=w2[4]; t5[2]=w2[5];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3]; t4[3]=w3[4]; t5[3]=w3[5];
                        t0[4]=w4[0]; t1[4]=w4[1]; t2[4]=w4[2]; t3[4]=w4[3]; t4[4]=w4[4]; t5[4]=w4[5];
                        t0[5]=w5[0]; t1[5]=w5[1]; t2[5]=w5[2]; t3[5]=w5[3]; t4[5]=w5[4]; t5[5]=w5[5];
                    }                   
                    // d = B_t * d_t
                    for (int n = 0; n < 6; n++)
                    {   
                        d0[n] =  4*t0[n]           - 5*t2[n]           + t4[n];
                        d1[n] =          - 4*t1[n] - 4*t2[n] +   t3[n] + t4[n];
                        d2[n] =            4*t1[n] - 4*t2[n] -   t3[n] + t4[n];
                        d3[n] =          - 2*t1[n] -   t2[n] + 2*t3[n] + t4[n];
                        d4[n] =            2*t1[n] -   t2[n] - 2*t3[n] + t4[n];
                        d5[n] =            4*t1[n]           - 5*t3[n]          + t5[n];
                    }                   
                    // save to out_tm
                    for (int n = 0; n < 6; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 6] = d1[n];
                        out_tm0[n+12] = d2[n];
                        out_tm0[n+18] = d3[n];
                        out_tm0[n+24] = d4[n];
                        out_tm0[n+30] = d5[n];
                    }

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    r3 += 4;
                    r4 += 4;
                    r5 += 4;

                    out_tm0 += 36;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(36, tiles, outch, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[36] = {0};

                for (int q=0; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n=0; n<36; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n=0; n<36; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[4][6] = {
        //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
        //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
        // };

        // 0 =	r00 + r01 + r02 + r03 +	r04
        // 1 =		  r01 - r02 + 2 * (r03 - r04)
        // 2 =		  r01 + r02 + 4 * (r03 + r04)
        // 3 =		  r01 - r02 + 8 * (r03 - r04)  + r05
        

        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j=0; j<nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j*4);
                int* outRow1 = out.row<int>(j*4+1);
                int* outRow2 = out.row<int>(j*4+2);
                int* outRow3 = out.row<int>(j*4+3);                

                for(int i=0; i<nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j*nRowBlocks + i);

                    int s0[6],s1[6],s2[6],s3[6],s4[6],s5[6];
                    int w0[6],w1[6],w2[6],w3[6];
                    int d0[4],d1[4],d2[4],d3[4],d4[4],d5[4];
                    int o0[4],o1[4],o2[4],o3[4];
                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 6];
                        s2[n] = out_tile[n+12];
                        s3[n] = out_tile[n+18];
                        s4[n] = out_tile[n+24];
                        s5[n] = out_tile[n+30];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 6; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n] +   s3[n] +   s4[n];
                        w1[n] =         s1[n] - s2[n] + 2*s3[n] - 2*s4[n];
                        w2[n] =         s1[n] + s2[n] + 4*s3[n] + 4*s4[n];
                        w3[n] =         s1[n] - s2[n] + 8*s3[n] - 8*s4[n] + s5[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0]; d0[2] = w2[0]; d0[3] = w3[0];
                        d1[0] = w0[1]; d1[1] = w1[1]; d1[2] = w2[1]; d1[3] = w3[1];
                        d2[0] = w0[2]; d2[1] = w1[2]; d2[2] = w2[2]; d2[3] = w3[2];
                        d3[0] = w0[3]; d3[1] = w1[3]; d3[2] = w2[3]; d3[3] = w3[3];
                        d4[0] = w0[4]; d4[1] = w1[4]; d4[2] = w2[4]; d4[3] = w3[4];
                        d5[0] = w0[5]; d5[1] = w1[5]; d5[2] = w2[5]; d5[3] = w3[5];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 4; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] +   d3[n] +   d4[n];
                        o1[n] =         d1[n] - d2[n] + 2*d3[n] - 2*d4[n];
                        o2[n] =         d1[n] + d2[n] + 4*d3[n] + 4*d4[n];
                        o3[n] =         d1[n] - d2[n] + 8*d3[n] - 8*d4[n] + d5[n];
                    }
                    // save to top blob tm
                    for (int n = 0; n < 4; n++)
                    {
                        outRow0[n] = o0[n] / 576;
                        outRow1[n] = o1[n] / 576;
                        outRow2[n] = o2[n] / 576;
                        outRow3[n] = o3[n] / 576;
                    }

                    outRow0 += 4;
                    outRow1 += 4;
                    outRow2 += 4;
                    outRow3 += 4;
                }
            }
        }
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}